

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O0

err_t stb99ParamsStd(stb99_params *params,stb99_seed *seed,char *name)

{
  bool_t bVar1;
  int iVar2;
  char *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined7 in_stack_ffffffffffffffd8;
  octet in_stack_ffffffffffffffdf;
  err_t local_4;
  
  bVar1 = memIsValid(in_RDI,0x3d0);
  if (bVar1 == 0) {
LAB_00167c83:
    local_4 = 0x6d;
  }
  else {
    if (in_RSI != (undefined8 *)0x0) {
      bVar1 = memIsValid(in_RSI,0x128);
      if (bVar1 == 0) goto LAB_00167c83;
    }
    memSet(in_RDX,in_stack_ffffffffffffffdf,0x167ca1);
    if (in_RSI != (undefined8 *)0x0) {
      memSet(in_RDX,in_stack_ffffffffffffffdf,0x167cba);
    }
    iVar2 = strCmp(in_RDX,(char *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    if (iVar2 == 0) {
      *in_RDI = 0x27e;
      in_RDI[1] = 0x8f;
      memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0x167d07)
      ;
      memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0x167d24)
      ;
      memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0x167d41)
      ;
      memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0x167d5e)
      ;
      if (in_RSI != (undefined8 *)0x0) {
        *in_RSI = 0x27e;
        memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                0x167d8c);
        memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                0x167da6);
        memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                0x167dc3);
      }
      local_4 = 0;
    }
    else {
      iVar2 = strCmp(in_RDX,(char *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
      if (iVar2 == 0) {
        *in_RDI = 0x3fe;
        in_RDI[1] = 0xaf;
        memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                0x167e1d);
        memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                0x167e3a);
        memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                0x167e57);
        memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                0x167e74);
        if (in_RSI != (undefined8 *)0x0) {
          *in_RSI = 0x3fe;
          memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                  0x167ea2);
          memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                  0x167ebc);
          memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                  0x167ed9);
        }
        local_4 = 0;
      }
      else {
        iVar2 = strCmp(in_RDX,(char *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8))
        ;
        if (iVar2 == 0) {
          *in_RDI = 0x5fe;
          in_RDI[1] = 0xd0;
          memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                  0x167f33);
          memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                  0x167f50);
          memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                  0x167f6d);
          memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                  0x167f8a);
          if (in_RSI != (undefined8 *)0x0) {
            *in_RSI = 0x5fe;
            memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                    0x167fb8);
            memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                    0x167fd2);
            memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                    0x167fef);
          }
          local_4 = 0;
        }
        else {
          iVar2 = strCmp(in_RDX,(char *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8
                                                ));
          if (iVar2 == 0) {
            *in_RDI = 0x99e;
            in_RDI[1] = 0x101;
            memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                    0x168049);
            memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                    0x168066);
            memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                    0x168083);
            memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                    0x1680a0);
            if (in_RSI != (undefined8 *)0x0) {
              *in_RSI = 0x99e;
              memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                      0x1680ce);
              memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                      0x1680e8);
              memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                      0x168105);
            }
            local_4 = 0;
          }
          else {
            local_4 = 0xca;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

err_t stb99ParamsStd(stb99_params* params, stb99_seed* seed, const char* name)
{
	if (!memIsValid(params, sizeof(stb99_params)) ||
		!memIsNullOrValid(seed, sizeof(stb99_seed)))
		return ERR_BAD_INPUT;
	// подготовить params и seed
	memSetZero(params, sizeof(stb99_params));
	if (seed)
		memSetZero(seed, sizeof(stb99_seed));
	// найти params
	if (strEq(name, _test_params_name))
	{
		params->l = _test_params_l;
		params->r = _test_params_r;
		memCopy(params->p, _test_params_p, sizeof(_test_params_p));
		memCopy(params->q, _test_params_q, sizeof(_test_params_q));
		memCopy(params->a, _test_params_a, sizeof(_test_params_a));
		memCopy(params->d, _test_params_d, sizeof(_test_params_d));
		if (seed)
		{
			seed->l = _test_params_l;
			memCopy(seed->zi, _test_params_zi, sizeof(_test_params_zi));
			memCopy(seed->di, _test_params_di, sizeof(_test_params_di));
			memCopy(seed->ri, _test_params_ri, sizeof(_test_params_ri));
		}
		return ERR_OK;
	}
	if (strEq(name, _bds_params3_name))
	{
		params->l = _bds_params3_l;
		params->r = _bds_params3_r;
		memCopy(params->p, _bds_params3_p, sizeof(_bds_params3_p));
		memCopy(params->q, _bds_params3_q, sizeof(_bds_params3_q));
		memCopy(params->a, _bds_params3_a, sizeof(_bds_params3_a));
		memCopy(params->d, _bds_params_d, sizeof(_bds_params_d));
		if (seed)
		{
			seed->l = _bds_params3_l;
			memCopy(seed->zi, _bds_params_zi, sizeof(_bds_params_zi));
			memCopy(seed->di, _bds_params3_di, sizeof(_bds_params3_di));
			memCopy(seed->ri, _bds_params3_ri, sizeof(_bds_params3_ri));
		}
		return ERR_OK;
	}
	if (strEq(name, _bds_params6_name))
	{
		params->l = _bds_params6_l;
		params->r = _bds_params6_r;
		memCopy(params->p, _bds_params6_p, sizeof(_bds_params6_p));
		memCopy(params->q, _bds_params6_q, sizeof(_bds_params6_q));
		memCopy(params->a, _bds_params6_a, sizeof(_bds_params6_a));
		memCopy(params->d, _bds_params_d, sizeof(_bds_params_d));
		if (seed)
		{
			seed->l = _bds_params6_l;
			memCopy(seed->zi, _bds_params_zi, sizeof(_bds_params_zi));
			memCopy(seed->di, _bds_params6_di, sizeof(_bds_params6_di));
			memCopy(seed->ri, _bds_params6_ri, sizeof(_bds_params6_ri));
		}
		return ERR_OK;
	}
	if (strEq(name, _bds_params10_name))
	{
		params->l = _bds_params10_l;
		params->r = _bds_params10_r;
		memCopy(params->p, _bds_params10_p, sizeof(_bds_params10_p));
		memCopy(params->q, _bds_params10_q, sizeof(_bds_params10_q));
		memCopy(params->a, _bds_params10_a, sizeof(_bds_params10_a));
		memCopy(params->d, _bds_params_d, sizeof(_bds_params_d));
		if (seed)
		{
			seed->l = _bds_params10_l;
			memCopy(seed->zi, _bds_params_zi, sizeof(_bds_params_zi));
			memCopy(seed->di, _bds_params10_di, sizeof(_bds_params10_di));
			memCopy(seed->ri, _bds_params10_ri, sizeof(_bds_params10_ri));
		}
		return ERR_OK;
	}
	return ERR_FILE_NOT_FOUND;
}